

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_delimited.pb.cc
# Opt level: O0

void editions_unittest::GroupLikeFileScope::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  GroupLikeFileScope **v1;
  GroupLikeFileScope **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  GroupLikeFileScope *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  GroupLikeFileScope *from;
  GroupLikeFileScope *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (GroupLikeFileScope *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (GroupLikeFileScope *)to_msg;
  _this = (GroupLikeFileScope *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<editions_unittest::GroupLikeFileScope_const*>(&local_38);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<editions_unittest::GroupLikeFileScope*>(&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<editions_unittest::GroupLikeFileScope_const*,editions_unittest::GroupLikeFileScope*>
                       (v1,v2,"&from != _this");
  if (local_30 == (Nullable<const_char_*>)0x0) {
    puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    uVar1 = *puVar3;
    if ((uVar1 & 3) != 0) {
      if ((uVar1 & 1) != 0) {
        (from->field_0)._impl_.a_ = *(int32_t *)(absl_log_internal_check_op_result + 0x18);
      }
      if ((uVar1 & 2) != 0) {
        (from->field_0)._impl_.b_ = *(int32_t *)(absl_log_internal_check_op_result + 0x1c);
      }
    }
    puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                       (&(from->field_0)._impl_._has_bits_,0);
    *puVar3 = uVar1 | *puVar3;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_delimited.pb.cc"
             ,0x443,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

void GroupLikeFileScope::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<GroupLikeFileScope*>(&to_msg);
  auto& from = static_cast<const GroupLikeFileScope&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:editions_unittest.GroupLikeFileScope)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.a_ = from._impl_.a_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.b_ = from._impl_.b_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}